

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase::testRunEnded(StreamingReporterBase *this,TestRunStats *param_1)

{
  ThreadedSectionInfo *pTVar1;
  GroupInfo *pGVar2;
  pointer pcVar3;
  TestRunInfo *pTVar4;
  
  pTVar1 = (this->currentSectionInfo).m_p;
  if (pTVar1 != (ThreadedSectionInfo *)0x0) {
    (*(pTVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  (this->currentSectionInfo).m_p = (ThreadedSectionInfo *)0x0;
  Option<Catch::TestCaseInfo>::reset(&this->unusedTestCaseInfo);
  pGVar2 = (this->unusedGroupInfo).nullableValue;
  if ((pGVar2 != (GroupInfo *)0x0) &&
     (pcVar3 = (pGVar2->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar3 != &(pGVar2->name).field_2)) {
    operator_delete(pcVar3);
  }
  (this->unusedGroupInfo).nullableValue = (GroupInfo *)0x0;
  pTVar4 = (this->testRunInfo).nullableValue;
  if ((pTVar4 != (TestRunInfo *)0x0) &&
     (pcVar3 = (pTVar4->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar3 != &(pTVar4->name).field_2)) {
    operator_delete(pcVar3);
  }
  (this->testRunInfo).nullableValue = (TestRunInfo *)0x0;
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& /* _testRunStats */ ) {
            currentSectionInfo.reset();
            unusedTestCaseInfo.reset();
            unusedGroupInfo.reset();
            testRunInfo.reset();
        }